

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

void QCoreApplicationPrivate::checkReceiverThread(QObject *receiver)

{
  QThread::currentThread();
  QObject::thread(receiver);
  return;
}

Assistant:

void QCoreApplicationPrivate::checkReceiverThread(QObject *receiver)
{
    QThread *currentThread = QThread::currentThread();
    QThread *thr = receiver->thread();
    Q_ASSERT_X(currentThread == thr || !thr,
               "QCoreApplication::sendEvent",
               qPrintable(QString::fromLatin1("Cannot send events to objects owned by a different thread. "
               "Current thread %1. Receiver '%2' was created in thread %3").arg(
               QDebug::toString(currentThread), QDebug::toString(receiver), QDebug::toString(thr))));
    Q_UNUSED(currentThread);
    Q_UNUSED(thr);
}